

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool __thiscall Datetime::initializeLater(Datetime *this,Pig *pig)

{
  size_type sVar1;
  bool bVar2;
  uint c;
  size_type previous;
  tm *__tp;
  time_t tVar3;
  ulong uVar4;
  allocator<char> local_92;
  allocator<char> local_91;
  time_t now;
  string token;
  string local_50;
  
  previous = Pig::cursor(pig);
  token._M_dataplus._M_p = (pointer)&token.field_2;
  token._M_string_length = 0;
  token.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&now,"later",&local_91);
  bVar2 = Pig::skipPartial(pig,(string *)&now,&token,false);
  if ((bVar2) && ((ulong)(long)minimumMatchLength <= token._M_string_length)) {
    std::__cxx11::string::~string((string *)&now);
LAB_0014a4e7:
    c = Pig::peek(pig);
    bVar2 = unicodeLatinAlpha(c);
    if ((!bVar2) && (bVar2 = unicodeLatinDigit(c), !bVar2)) {
      now = time((time_t *)0x0);
      __tp = localtime(&now);
      __tp->tm_mon = 0xb;
      __tp->tm_year = 0x1fa3;
      __tp->tm_sec = 0;
      __tp->tm_min = 0;
      __tp->tm_hour = 0;
      __tp->tm_mday = 0x1e;
      __tp->tm_isdst = -1;
      tVar3 = mktime(__tp);
      this->_date = tVar3;
      bVar2 = true;
      goto LAB_0014a514;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"someday",&local_92);
    bVar2 = Pig::skipPartial(pig,&local_50,&token,false);
    sVar1 = token._M_string_length;
    if (bVar2) {
      uVar4 = 4;
      if (4 < minimumMatchLength) {
        uVar4 = (ulong)(uint)minimumMatchLength;
      }
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&now);
      if (uVar4 <= sVar1) goto LAB_0014a4e7;
    }
    else {
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&now);
    }
  }
  Pig::restoreTo(pig,previous);
  bVar2 = false;
LAB_0014a514:
  std::__cxx11::string::~string((string *)&token);
  return bVar2;
}

Assistant:

bool Datetime::initializeLater (Pig& pig)
{
  auto checkpoint = pig.cursor ();

  std::string token;
  if ((pig.skipPartial ("later", token) &&
      token.length () >= static_cast <std::string::size_type> (Datetime::minimumMatchLength))

      ||

     (pig.skipPartial ("someday", token) &&
      token.length () >= static_cast <std::string::size_type> (std::max (Datetime::minimumMatchLength, 4))))
  {
    auto following = pig.peek ();
    if (! unicodeLatinAlpha (following) &&
        ! unicodeLatinDigit (following))
    {
      time_t now = time (nullptr);
      struct tm* t = localtime (&now);

      t->tm_hour = t->tm_min = t->tm_sec = 0;
      t->tm_year = 8099;  // Year 9999
      t->tm_mon = 11;
      t->tm_mday = 30;
      t->tm_isdst = -1;
      _date = mktime (t);
      return true;
    }
  }

  pig.restoreTo (checkpoint);
  return false;
}